

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::PostFlagParsingInit(UnitTestImpl *this)

{
  TestEventListeners *this_00;
  TestEventListener *listener;
  UnitTestImpl *in_RDI;
  UnitTestImpl *in_stack_00000070;
  UnitTestImpl *in_stack_000000b0;
  UnitTestImpl *in_stack_ffffffffffffffe0;
  
  if ((in_RDI->post_flag_parse_init_performed_ & 1U) == 0) {
    in_RDI->post_flag_parse_init_performed_ = true;
    InitDeathTestSubprocessControlInfo(in_stack_ffffffffffffffe0);
    SuppressTestEventsIfInSubprocess(in_stack_ffffffffffffffe0);
    RegisterParameterizedTests(in_stack_ffffffffffffffe0);
    ConfigureXmlOutput(in_stack_000000b0);
    if ((FLAGS_gtest_brief & 1) != 0) {
      this_00 = listeners(in_RDI);
      listener = (TestEventListener *)operator_new(8);
      BriefUnitTestResultPrinter::BriefUnitTestResultPrinter((BriefUnitTestResultPrinter *)this_00);
      TestEventListeners::SetDefaultResultPrinter((TestEventListeners *)in_RDI,listener);
    }
    ConfigureStreamingOutput(in_stack_00000070);
  }
  return;
}

Assistant:

void UnitTestImpl::PostFlagParsingInit() {
  // Ensures that this function does not execute more than once.
  if (!post_flag_parse_init_performed_) {
    post_flag_parse_init_performed_ = true;

#if defined(GTEST_CUSTOM_TEST_EVENT_LISTENER_)
    // Register to send notifications about key process state changes.
    listeners()->Append(new GTEST_CUSTOM_TEST_EVENT_LISTENER_());
#endif  // defined(GTEST_CUSTOM_TEST_EVENT_LISTENER_)

#ifdef GTEST_HAS_DEATH_TEST
    InitDeathTestSubprocessControlInfo();
    SuppressTestEventsIfInSubprocess();
#endif  // GTEST_HAS_DEATH_TEST

    // Registers parameterized tests. This makes parameterized tests
    // available to the UnitTest reflection API without running
    // RUN_ALL_TESTS.
    RegisterParameterizedTests();

    // Configures listeners for XML output. This makes it possible for users
    // to shut down the default XML output before invoking RUN_ALL_TESTS.
    ConfigureXmlOutput();

    if (GTEST_FLAG_GET(brief)) {
      listeners()->SetDefaultResultPrinter(new BriefUnitTestResultPrinter);
    }

#if GTEST_CAN_STREAM_RESULTS_
    // Configures listeners for streaming test results to the specified server.
    ConfigureStreamingOutput();
#endif  // GTEST_CAN_STREAM_RESULTS_

#ifdef GTEST_HAS_ABSL
    if (GTEST_FLAG_GET(install_failure_signal_handler)) {
      absl::FailureSignalHandlerOptions options;
      absl::InstallFailureSignalHandler(options);
    }
#endif  // GTEST_HAS_ABSL
  }
}